

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servls.cpp
# Opt level: O2

ServiceEnumeration * icu_63::ServiceEnumeration::create(ICULocaleService *service)

{
  uint in_EAX;
  ServiceEnumeration *this;
  size_t in_RSI;
  UErrorCode status;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  this = (ServiceEnumeration *)UMemory::operator_new((UMemory *)0xb8,in_RSI);
  if (this != (ServiceEnumeration *)0x0) {
    ServiceEnumeration(this,service,(UErrorCode *)((long)&uStack_18 + 4));
    if (uStack_18._4_4_ < 1) {
      return this;
    }
    (*(this->super_StringEnumeration).super_UObject._vptr_UObject[1])(this);
  }
  return (ServiceEnumeration *)0x0;
}

Assistant:

static ServiceEnumeration* create(const ICULocaleService* service) {
        UErrorCode status = U_ZERO_ERROR;
        ServiceEnumeration* result = new ServiceEnumeration(service, status);
        if (U_SUCCESS(status)) {
            return result;
        }
        delete result;
        return NULL;
    }